

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  undefined8 *local_20;
  DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_30 = tryToCharSequence<char_const[5],kj::ArrayPtr<char_const>>((char (*) [5])*param_2);
  params = (ArrayPtr<const_char> *)(local_20 + 3);
  local_40 = tryToCharSequence<capnp::Text::Reader,kj::ArrayPtr<char_const>>
                       ((Reader *)(local_20 + 1));
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,params,(StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}